

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTElement.h
# Opt level: O1

ostream * ninx::parser::element::operator<<(ostream *strm,ASTElement *a)

{
  ostream *poVar1;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  (*a->_vptr_ASTElement[3])(&local_30,a,0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(strm,(char *)local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream &strm, const ASTElement &a) {
                    return strm << a.dump(0);
                }